

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O3

ScalarFunction * duckdb::ListFlattenFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  FunctionNullHandling in_stack_ffffffffffffff08;
  bind_lambda_function_t in_stack_ffffffffffffff10;
  scalar_function_t local_e8;
  LogicalType local_c8;
  LogicalType local_b0;
  LogicalType local_98;
  LogicalType local_80;
  vector<duckdb::LogicalType,_true> local_68;
  LogicalType local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType(&local_38,ANY);
  LogicalType::LIST(&local_98,&local_38);
  LogicalType::LIST(&local_80,&local_98);
  __l._M_len = 1;
  __l._M_array = &local_80;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68,__l,
             (allocator_type *)&stack0xffffffffffffff17);
  LogicalType::LogicalType(&local_c8,ANY);
  LogicalType::LIST(&local_b0,&local_c8);
  local_e8.super__Function_base._M_functor._8_8_ = 0;
  local_e8.super__Function_base._M_functor._M_unused._M_object = ListFlattenFunction;
  local_e8._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_e8.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_50,INVALID);
  ScalarFunction::ScalarFunction
            (in_RDI,&local_68,&local_b0,&local_e8,ListFlattenBind,
             (bind_scalar_function_extended_t)0x0,ListFlattenStats,(init_local_state_t)0x0,
             (LogicalType)ZEXT824(&local_50),CONSISTENT,in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff10);
  LogicalType::~LogicalType(&local_50);
  if (local_e8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_e8.super__Function_base._M_manager)
              ((_Any_data *)&local_e8,(_Any_data *)&local_e8,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_b0);
  LogicalType::~LogicalType(&local_c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  LogicalType::~LogicalType(&local_80);
  LogicalType::~LogicalType(&local_98);
  LogicalType::~LogicalType(&local_38);
  return in_RDI;
}

Assistant:

ScalarFunction ListFlattenFun::GetFunction() {
	return ScalarFunction({LogicalType::LIST(LogicalType::LIST(LogicalType::ANY))}, LogicalType::LIST(LogicalType::ANY),
	                      ListFlattenFunction, ListFlattenBind, nullptr, ListFlattenStats);
}